

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void inspect_serialized_object<char_const*>
               (char **serialized_bytes,bool *is_isotree_model,bool *is_compatible,
               bool *has_combined_objects,bool *has_IsoForest,bool *has_ExtIsoForest,
               bool *has_Imputer,bool *has_Indexer,bool *has_metadata,size_t *size_metadata,
               bool *has_same_int_size,bool *has_same_size_t_size,bool *has_same_endianness,
               bool *lacks_range_penalty,bool *lacks_scoring_metric)

{
  bool *lacks_scoring_metric_00;
  byte *in_RCX;
  bool *in_RDX;
  byte *in_RSI;
  char **in_RDI;
  undefined1 *in_R8;
  bool *in_R9;
  undefined1 *in_stack_00000008;
  undefined1 *in_stack_00000010;
  undefined1 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  size_t in_stack_00000038;
  bool *in_stack_00000040;
  bool *in_stack_00000048;
  size_t size_model [4];
  uint8_t model_type;
  PlatformEndianness saved_endian;
  PlatformSize saved_size_t;
  PlatformSize saved_int_t;
  bool has_incomplete_watermark;
  bool has_same_double;
  bool lacks_indexer;
  char *saved_position;
  void *in_stack_000000c0;
  undefined1 *ptr;
  bool *in_stack_ffffffffffffff58;
  char **in_stack_ffffffffffffff60;
  undefined8 local_98;
  bool *in_stack_ffffffffffffff70;
  PlatformSize *in_stack_ffffffffffffff78;
  PlatformSize *in_stack_ffffffffffffff80;
  undefined8 uVar1;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  bool *in_stack_ffffffffffffff90;
  uint5 in_stack_ffffffffffffff98;
  bool bVar2;
  
  lacks_scoring_metric_00 = (bool *)set_return_position(*in_RDI);
  *in_RSI = 0;
  *in_RDX = false;
  *in_RCX = 0;
  *in_R8 = 0;
  *in_R9 = false;
  *in_stack_00000008 = 0;
  *in_stack_00000010 = 0;
  *in_stack_00000018 = 0;
  *in_stack_00000020 = 0;
  bVar2 = false;
  ptr = &stack0xffffffffffffff98;
  check_setup_info<char_const*>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(bool *)&stack0xffffffffffffff9f,
             in_stack_00000048,in_stack_00000040,in_RDX,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,
             (PlatformEndianness *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff90,(bool *)(ulong)in_stack_ffffffffffffff98,
             lacks_scoring_metric_00,in_R9);
  if (((*in_RSI & 1) != 0) && ((*in_RDX & 1U) != 0)) {
    read_bytes<unsigned_char>(ptr,in_stack_00000038,(char **)0x67f4fb);
    switch(in_stack_ffffffffffffff8f) {
    case 1:
      *in_R8 = 1;
      break;
    case 2:
      *in_R9 = true;
      break;
    case 3:
      *in_stack_00000008 = 1;
      break;
    case 5:
      *in_stack_00000010 = 1;
    case 4:
      *in_RCX = 1;
    }
    if ((*in_RCX & 1) != 0) {
      uVar1 = 0;
      local_98 = 0;
      read_bytes<unsigned_char>(ptr,in_stack_00000038,(char **)0x67f599);
      switch(in_stack_ffffffffffffff8f) {
      case 1:
        *in_R8 = 1;
        break;
      case 2:
        *in_R9 = true;
        break;
      default:
        break;
      case 4:
        *in_R8 = 1;
        *in_stack_00000008 = 1;
        break;
      case 5:
        *in_R9 = true;
        *in_stack_00000008 = 1;
        break;
      case 6:
        *in_R8 = 1;
        *in_stack_00000018 = 1;
        read_bytes_size_t<char_const*>
                  (in_stack_000000c0,(size_t)serialized_bytes,(char **)is_isotree_model,
                   is_compatible._4_4_,is_compatible._3_1_);
        *in_stack_00000020 = (&local_98)[(int)(((bVar2 ^ 0xffU) & 1) + 2)];
        break;
      case 7:
        *in_R9 = true;
        *in_stack_00000018 = 1;
        read_bytes_size_t<char_const*>
                  (in_stack_000000c0,(size_t)serialized_bytes,(char **)is_isotree_model,
                   is_compatible._4_4_,is_compatible._3_1_);
        *in_stack_00000020 = (&local_98)[(int)(((bVar2 ^ 0xffU) & 1) + 2)];
        break;
      case 8:
        *in_R8 = 1;
        *in_stack_00000008 = 1;
        *in_stack_00000018 = 1;
        read_bytes_size_t<char_const*>
                  (in_stack_000000c0,(size_t)serialized_bytes,(char **)is_isotree_model,
                   is_compatible._4_4_,is_compatible._3_1_);
        *in_stack_00000020 = (&local_98)[(int)(((bVar2 ^ 0xffU) & 1) + 2)];
        break;
      case 9:
        *in_R9 = true;
        *in_stack_00000008 = 1;
        *in_stack_00000018 = 1;
        read_bytes_size_t<char_const*>
                  (in_stack_000000c0,(size_t)serialized_bytes,(char **)is_isotree_model,
                   is_compatible._4_4_,is_compatible._3_1_);
        *in_stack_00000020 = (&local_98)[(int)(((bVar2 ^ 0xffU) & 1) + 2)];
        break;
      case 0xc:
        *in_R8 = 1;
        *in_stack_00000010 = 1;
        break;
      case 0xd:
        *in_R8 = 1;
        *in_stack_00000008 = 1;
        *in_stack_00000010 = 1;
        break;
      case 0xe:
        *in_R9 = true;
        *in_stack_00000010 = 1;
        break;
      case 0xf:
        *in_R9 = true;
        *in_stack_00000008 = 1;
        *in_stack_00000010 = 1;
        break;
      case 0x10:
        *in_R8 = 1;
        *in_stack_00000010 = 1;
        *in_stack_00000018 = 1;
        read_bytes_size_t<char_const*>
                  (in_stack_000000c0,(size_t)serialized_bytes,(char **)is_isotree_model,
                   is_compatible._4_4_,is_compatible._3_1_);
        *in_stack_00000020 = uVar1;
        break;
      case 0x11:
        *in_R9 = true;
        *in_stack_00000010 = 1;
        *in_stack_00000018 = 1;
        read_bytes_size_t<char_const*>
                  (in_stack_000000c0,(size_t)serialized_bytes,(char **)is_isotree_model,
                   is_compatible._4_4_,is_compatible._3_1_);
        *in_stack_00000020 = uVar1;
        break;
      case 0x12:
        *in_R8 = 1;
        *in_stack_00000008 = 1;
        *in_stack_00000010 = 1;
        *in_stack_00000018 = 1;
        read_bytes_size_t<char_const*>
                  (in_stack_000000c0,(size_t)serialized_bytes,(char **)is_isotree_model,
                   is_compatible._4_4_,is_compatible._3_1_);
        *in_stack_00000020 = uVar1;
        break;
      case 0x13:
        *in_R9 = true;
        *in_stack_00000008 = 1;
        *in_stack_00000010 = 1;
        *in_stack_00000018 = 1;
        read_bytes_size_t<char_const*>
                  (in_stack_000000c0,(size_t)serialized_bytes,(char **)is_isotree_model,
                   is_compatible._4_4_,is_compatible._3_1_);
        *in_stack_00000020 = uVar1;
      }
    }
    return_to_position(in_RDI,lacks_scoring_metric_00);
  }
  return;
}

Assistant:

void inspect_serialized_object
(
    itype &serialized_bytes,
    bool &is_isotree_model,
    bool &is_compatible,
    bool &has_combined_objects,
    bool &has_IsoForest,
    bool &has_ExtIsoForest,
    bool &has_Imputer,
    bool &has_Indexer,
    bool &has_metadata,
    size_t &size_metadata,
    bool &has_same_int_size,
    bool &has_same_size_t_size,
    bool &has_same_endianness,
    bool &lacks_range_penalty,
    bool &lacks_scoring_metric
)
{
    auto saved_position = set_return_position(serialized_bytes);

    is_isotree_model = false;
    is_compatible = false;
    has_combined_objects = false;
    has_IsoForest = false;
    has_ExtIsoForest = false;
    has_Imputer = false;
    has_Indexer = false;
    has_metadata = false;
    size_metadata = 0;

    bool lacks_indexer = false;

    bool has_same_double = false;
    bool has_incomplete_watermark = false;
    PlatformSize saved_int_t;
    PlatformSize saved_size_t;
    PlatformEndianness saved_endian;
    check_setup_info(
        serialized_bytes,
        is_isotree_model,
        has_incomplete_watermark,
        has_same_double,
        has_same_int_size,
        has_same_size_t_size,
        has_same_endianness,
        saved_int_t,
        saved_size_t,
        saved_endian,
        is_compatible,
        lacks_range_penalty,
        lacks_scoring_metric,
        lacks_indexer
    );

    if (!is_isotree_model || !is_compatible)
        return;

    uint8_t model_type;
    read_bytes<uint8_t>((void*)&model_type, (size_t)1, serialized_bytes);

    switch(model_type)
    {
        case IsoForestModel:
        {
            has_IsoForest = true;
            break;
        }

        case ExtIsoForestModel:
        {
            has_ExtIsoForest = true;
            break;
        }

        case ImputerModel:
        {
            has_Imputer = true;
            break;
        }

        case IndexerModel:
        {
            has_Indexer = true;
        }

        case AllObjectsCombined:
        {
            has_combined_objects = true;
            break;
        }

        default:
        {

        }
    }

    if (has_combined_objects)
    {
        size_t size_model[4] = {0};

        read_bytes<uint8_t>((void*)&model_type, (size_t)1, serialized_bytes);
        switch(model_type)
        {
            case HasSingleVarModelNext:
            {
                has_IsoForest = true;
                break;
            }
            case HasExtModelNext:
            {
                has_ExtIsoForest = true;
                break;
            }
            case HasSingleVarModelPlusImputerNext:
            {
                has_IsoForest = true;
                has_Imputer = true;
                break;
            }
            case HasSingleVarModelPlusIndexerNext:
            {
                has_IsoForest = true;
                has_Indexer = true;
                break;
            }
            case HasSingleVarModelPlusImputerPlusIndexerNext:
            {
                has_IsoForest = true;
                has_Imputer = true;
                has_Indexer = true;
                break;
            }
            case HasExtModelPlusImputerNext:
            {
                has_ExtIsoForest = true;
                has_Imputer = true;
                break;
            }
            case HasExtModelPlusIndexerNext:
            {
                has_ExtIsoForest = true;
                has_Indexer = true;
                break;
            }
            case HasExtModelPlusImputerPlusIndexerNext:
            {
                has_ExtIsoForest = true;
                has_Imputer = true;
                has_Indexer = true;
                break;
            }
            case HasSingleVarModelPlusMetadataNext:
            {
                has_IsoForest = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)(3+!lacks_indexer), serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[2+!lacks_indexer];
                break;
            }
            case HasSingleVarModelPlusIndexerPlusMetadataNext:
            {
                has_IsoForest = true;
                has_Indexer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)4, serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[3];
                break;
            }
            case HasExtModelPlusMetadataNext:
            {
                has_ExtIsoForest = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)(3+!lacks_indexer), serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[2+!lacks_indexer];
                break;
            }
            case HasExtModelPlusIndexerPlusMetadataNext:
            {
                has_ExtIsoForest = true;
                has_Indexer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)4, serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[3];
                break;
                break;
            }
            case HasSingleVarModelPlusImputerPlusMetadataNext:
            {
                has_IsoForest = true;
                has_Imputer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)(3+!lacks_indexer), serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[2+!lacks_indexer];
                break;
            }
            case HasSingleVarModelPlusImputerPlusIndexerPlusMetadataNext:
            {
                has_IsoForest = true;
                has_Imputer = true;
                has_Indexer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)4, serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[3];
                break;
            }
            case HasExtModelPlusImputerPlusMetadataNext:
            {
                has_ExtIsoForest = true;
                has_Imputer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)(3+!lacks_indexer), serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[2+!lacks_indexer];
                break;
            }
            case HasExtModelPlusImputerPlusIndexerPlusMetadataNext:
            {
                has_ExtIsoForest = true;
                has_Imputer = true;
                has_Indexer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)4, serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[3];
                break;
            }
            
            default:
            {

            }
        }
    }

    return_to_position(serialized_bytes, saved_position);
}